

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O0

void mwAbort(void)

{
  int iVar1;
  char *pcVar2;
  void *pvVar3;
  int local_38;
  int local_34;
  int errors;
  int j;
  int i;
  int c;
  time_t tid;
  char *data;
  mwMarker *mrk;
  mwData *mw;
  
  _i = time((time_t *)0x0);
  pcVar2 = ctime((time_t *)&i);
  mwWrite("\nStopped at %s\n",pcVar2);
  if (mwInited == 0) {
    mwWrite("internal: mwAbort(): MEMWATCH not initialized!\n");
  }
  mwDropAll();
  while (mwFirstMark != (mwMarker *)0x0) {
    data = (char *)mwFirstMark->next;
    mwWrite("mark: %p: %s\n",mwFirstMark->host,mwFirstMark->text);
    free(mwFirstMark->text);
    free(mwFirstMark);
    mwErrors = mwErrors + 1;
    mwFirstMark = (mwMarker *)data;
  }
  local_38 = 0;
LAB_00107b79:
  do {
    if (mwHead == (mwData *)0x0 || 2 < local_38) {
LAB_00107ef1:
      if (mwNmlNumAlloc != 0) {
        mwWrite("internal: NoMansLand block counter %ld, not zero\n",mwNmlNumAlloc);
      }
      if (mwNmlCurAlloc != 0) {
        mwWrite("internal: NoMansLand byte counter %ld, not zero\n",mwNmlCurAlloc);
      }
      mwStatReport();
      mwFlush();
      mwInited = 0;
      mwTail = (mwData *)0x0;
      mwHead = (mwData *)0x0;
      if (mwErrors != 0) {
        fprintf(_stderr,"MEMWATCH detected %ld anomalies\n",mwErrors);
      }
      mwLogFile((char *)0x0);
      mwErrors = 0;
      return;
    }
    iVar1 = mwIsOwned(mwHead,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Freeind[P]ita/memwatch.c"
                      ,0x230);
    if (iVar1 != 0) {
      mwFlushW(0);
      if ((mwHead->flag & 1) == 0) {
        mwErrors = mwErrors + 1;
        tid = (long)&mwHead->prev + (long)mwDataSize;
        mwWrite("unfreed: <%ld> %s(%d), %ld bytes at %p ",mwHead->count,mwHead->file,
                (ulong)(uint)mwHead->line,mwHead->size,tid + mwOverflowZoneSize);
        iVar1 = mwCheckOF((void *)tid);
        if (iVar1 != 0) {
          mwWrite("[underflowed] ");
          mwFlush();
        }
        iVar1 = mwCheckOF((void *)(tid + mwOverflowZoneSize + mwHead->size));
        if (iVar1 != 0) {
          mwWrite("[overflowed] ");
          mwFlush();
        }
        mwWrite(" \t{");
        local_34 = 0x10;
        if (mwHead->size < 0x10) {
          local_34 = (int)mwHead->size;
        }
        for (errors = 0; errors < 0x10; errors = errors + 1) {
          if (errors < local_34) {
            mwWrite("%02X ",(ulong)*(byte *)(tid + mwOverflowZoneSize + (long)errors));
          }
          else {
            mwWrite(".. ");
          }
        }
        for (errors = 0; errors < local_34; errors = errors + 1) {
          j = (int)*(char *)(tid + mwOverflowZoneSize + (long)errors);
          if ((j < 0x20) || (0x7e < j)) {
            j = 0x2e;
          }
          mwWrite("%c",(ulong)(uint)j);
        }
        mwWrite("}\n");
        mrk = (mwMarker *)mwHead;
        mwUnlink(mwHead,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Freeind[P]ita/memwatch.c",
                 0x25f);
        free(mrk);
      }
      else {
        tid = (long)&mwHead->prev + (long)mwOverflowZoneSize + (long)mwDataSize;
        pvVar3 = mwTestMem((void *)tid,(uint)mwHead->size,0xfc);
        if (pvVar3 != (void *)0x0) {
          mwErrors = mwErrors + 1;
          mwWrite("wild pointer: <%ld> NoMansLand %p alloc\'d at %s(%d)\n",mwHead->count,
                  tid + mwOverflowZoneSize,mwHead->file,(ulong)(uint)mwHead->line);
          mwFlush();
        }
        mwNmlNumAlloc = mwNmlNumAlloc + -1;
        mwNmlCurAlloc = mwNmlCurAlloc - mwHead->size;
        mrk = (mwMarker *)mwHead;
        mwUnlink(mwHead,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Freeind[P]ita/memwatch.c",
                 0x26c);
        free(mrk);
      }
      goto LAB_00107b79;
    }
    if (2 < local_38) {
      mwWrite("internal: NML/unfreed scan aborted, heap too damaged\n");
      mwFlush();
      goto LAB_00107ef1;
    }
    local_38 = local_38 + 1;
    mwWrite("internal: NML/unfreed scan restarting\n");
    mwFlush();
  } while( true );
}

Assistant:

void mwAbort(void)
{
	mwData *mw;
	mwMarker *mrk;
	char *data;
	time_t tid;
	int c, i, j;
	int errors;

	tid = time(NULL);
	mwWrite("\nStopped at %s\n", ctime(&tid));

	if (!mwInited) {
		mwWrite("internal: mwAbort(): MEMWATCH not initialized!\n");
	}

	/* release the grab list */
	mwDropAll();

	/* report mwMarked items */
	while (mwFirstMark) {
		mrk = mwFirstMark->next;
		mwWrite("mark: %p: %s\n", mwFirstMark->host, mwFirstMark->text);
		free(mwFirstMark->text);
		free(mwFirstMark);
		mwFirstMark = mrk;
		mwErrors ++;
	}

	/* release all still allocated memory */
	errors = 0;
	while (mwHead != NULL && errors < 3) {
		if (!mwIsOwned(mwHead, __FILE__, __LINE__)) {
			if (errors < 3) {
				errors ++;
				mwWrite("internal: NML/unfreed scan restarting\n");
				FLUSH();
				mwHead = mwHead;
				continue;
			}
			mwWrite("internal: NML/unfreed scan aborted, heap too damaged\n");
			FLUSH();
			break;
		}
		mwFlushW(0);
		if (!(mwHead->flag & MW_NML)) {
			mwErrors++;
			data = ((char *)mwHead) + mwDataSize;
			mwWrite("unfreed: <%ld> %s(%d), %ld bytes at %p ",
					mwHead->count, mwHead->file, mwHead->line, (long)mwHead->size, data + mwOverflowZoneSize);
			if (mwCheckOF(data)) {
				mwWrite("[underflowed] ");
				FLUSH();
			}
			if (mwCheckOF((data + mwOverflowZoneSize + mwHead->size))) {
				mwWrite("[overflowed] ");
				FLUSH();
			}
			mwWrite(" \t{");
			j = 16;
			if (mwHead->size < 16) {
				j = (int) mwHead->size;
			}
			for (i = 0; i < 16; i++) {
				if (i < j) mwWrite("%02X ",
									   (unsigned char) * (data + mwOverflowZoneSize + i));
				else {
					mwWrite(".. ");
				}
			}
			for (i = 0; i < j; i++) {
				c = *(data + mwOverflowZoneSize + i);
				if (c < 32 || c > 126) {
					c = '.';
				}
				mwWrite("%c", c);
			}
			mwWrite("}\n");
			mw = mwHead;
			mwUnlink(mw, __FILE__, __LINE__);
			free(mw);
		} else {
			data = ((char *)mwHead) + mwDataSize + mwOverflowZoneSize;
			if (mwTestMem(data, mwHead->size, MW_VAL_NML)) {
				mwErrors++;
				mwWrite("wild pointer: <%ld> NoMansLand %p alloc'd at %s(%d)\n",
						mwHead->count, data + mwOverflowZoneSize, mwHead->file, mwHead->line);
				FLUSH();
			}
			mwNmlNumAlloc --;
			mwNmlCurAlloc -= mwHead->size;
			mw = mwHead;
			mwUnlink(mw, __FILE__, __LINE__);
			free(mw);
		}
	}

	if (mwNmlNumAlloc) {
		mwWrite("internal: NoMansLand block counter %ld, not zero\n", mwNmlNumAlloc);
	}
	if (mwNmlCurAlloc) {
		mwWrite("internal: NoMansLand byte counter %ld, not zero\n", mwNmlCurAlloc);
	}

	/* report statistics */
	mwStatReport();
	FLUSH();

	mwInited = 0;
	mwHead = mwTail = NULL;
	if (mwErrors) {
		fprintf(mwSTDERR, "MEMWATCH detected %ld anomalies\n", mwErrors);
	}
	mwLogFile(NULL);
	mwErrors = 0;

	MW_MUTEX_TERM();

}